

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffchfl(fitsfile *fptr,int *status)

{
  int iVar1;
  int iVar2;
  fitsfile *in_RSI;
  int *in_RDI;
  char *blanks;
  char rec [81];
  LONGLONG endpos;
  int gotend;
  int i;
  int nblank;
  char *status_00;
  char local_88 [4];
  int in_stack_ffffffffffffff7c;
  LONGLONG in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  LONGLONG in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  int *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  int local_20;
  int in_stack_ffffffffffffffe4;
  int local_4;
  
  status_00 = "                                                                                ";
  if (in_RSI->HDUposition < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_RSI,in_stack_ffffffffffffffe4,
             (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0);
    }
    iVar1 = (int)((*(long *)(*(long *)(in_RDI + 2) + 0x88) - *(long *)(*(long *)(in_RDI + 2) + 0x70)
                  ) / 0x50);
    ffmbyt(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
           (int *)status_00);
    iVar3 = 0;
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      ffgbyt((fitsfile *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      iVar2 = strncmp(local_88,"END     ",8);
      if (iVar2 == 0) {
        if (iVar3 != 0) {
          in_RSI->HDUposition = 0xfe;
          ffpmsg((char *)0x174b6a);
        }
        iVar3 = 1;
        iVar2 = strncmp(&stack0xffffffffffffff80,(char *)((long)status_00 + 8),0x48);
        if (iVar2 != 0) {
          in_RSI->HDUposition = 0xfd;
          ffpmsg((char *)0x174bad);
        }
      }
      else if ((iVar3 != 0) && (iVar2 = strncmp(local_88,status_00,0x50), iVar2 != 0)) {
        in_RSI->HDUposition = 0xfe;
        ffpmsg((char *)0x174be9);
      }
      if (0 < in_RSI->HDUposition) {
        ffpmsg((char *)0x174c09);
        return in_RSI->HDUposition;
      }
    }
    local_4 = in_RSI->HDUposition;
  }
  else {
    local_4 = in_RSI->HDUposition;
  }
  return local_4;
}

Assistant:

int ffchfl( fitsfile *fptr, int *status)
{
   int nblank,i,gotend;
   LONGLONG endpos;
   char rec[FLEN_CARD];
   char *blanks="                                                                                ";  /*  80 spaces  */

   if( *status > 0 ) return (*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

   /*   calculate the number of blank keyword slots in the header  */

   endpos=(fptr->Fptr)->headend;
   nblank=(long) (((fptr->Fptr)->datastart-endpos)/80);

   /*   move the i/o pointer to the end of the header keywords   */

   ffmbyt(fptr,endpos,TRUE,status);

   /*   find the END card (there may be blank keywords perceeding it)   */

   gotend=FALSE;
   for(i=0;i<nblank;i++) {
      ffgbyt(fptr,80,rec,status);
      if( !strncmp(rec, "END     ", 8) ) {
         if( gotend ) {
            /*   There is a duplicate END record   */
            *status=BAD_HEADER_FILL;
            ffpmsg("Warning: Header fill area contains duplicate END card:");
         }
         gotend=TRUE;
         if( strncmp( rec+8, blanks+8, 72) ) {
            /*   END keyword has extra characters   */
            *status=END_JUNK;
            ffpmsg(
            "Warning: END keyword contains extraneous non-blank characters:");
         }
      } else if( gotend ) {
         if( strncmp( rec, blanks, 80 ) ) {
            /*   The fill area contains extraneous characters   */
            *status=BAD_HEADER_FILL;
            ffpmsg(
         "Warning: Header fill area contains extraneous non-blank characters:");
         }
      }

      if( *status > 0 ) {
         rec[FLEN_CARD - 1] = '\0';  /* make sure string is null terminated */
         ffpmsg(rec);
         return( *status );
      }
   }
   return( *status );
}